

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_common.hxx
# Opt level: O2

void calc_server::loop(void)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  string prompt;
  string local_438;
  char cmd [1000];
  
  std::__cxx11::to_string(&local_438,stuff);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tokens,
                 "calc ",&local_438);
  std::operator+(&prompt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &tokens,"> ");
  std::__cxx11::string::~string((string *)&tokens);
  std::__cxx11::string::~string((string *)&local_438);
  do {
    poVar2 = std::operator<<((ostream *)&std::cout,"\x1b[32m");
    poVar2 = std::operator<<(poVar2,(string *)&prompt);
    std::operator<<(poVar2,"\x1b[0m");
    plVar3 = (long *)std::istream::getline((char *)&std::cin,(long)cmd);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) break;
    tokenize_abi_cxx11_(&tokens,(calc_server *)cmd,(char *)0x20,(char)*(long *)(*plVar3 + -0x18));
    bVar1 = do_cmd(&tokens);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tokens);
  } while (bVar1);
  std::__cxx11::string::~string((string *)&prompt);
  return;
}

Assistant:

void loop() {
    char cmd[1000];
    std::string prompt = "calc " + std::to_string(stuff.server_id_) + "> ";
    while (true) {
#if defined(__linux__) || defined(__APPLE__)
        std::cout << _CLM_GREEN << prompt << _CLM_END;
#else
        std::cout << prompt;
#endif
        if (!std::cin.getline(cmd, 1000)) {
            break;
        }

        std::vector<std::string> tokens = tokenize(cmd);
        bool cont = do_cmd(tokens);
        if (!cont) break;
    }
}